

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O0

WavFileWriter * __thiscall WavFileWriter::WriteFrame(WavFileWriter *this,FrameBuffer *FB)

{
  value_type pWVar1;
  bool bVar2;
  bool bVar3;
  ui32_t uVar4;
  int iVar5;
  size_type sVar6;
  reference ppWVar7;
  uint *puVar8;
  byte_t *pbVar9;
  reference ppWVar10;
  _List_node_base *in_RDX;
  WavFileElement local_e0;
  _Self local_78;
  _List_node_base *local_70;
  undefined1 local_61;
  _List_node_base *local_60;
  uint local_54;
  iterator iStack_50;
  ui32_t c;
  _List_node_base *local_48;
  byte_t *local_40;
  byte_t *end_p;
  byte_t *p;
  iterator iStack_28;
  ui32_t sample_size;
  iterator fi;
  FrameBuffer *FB_local;
  WavFileWriter *this_local;
  Result_t *result;
  
  fi._M_node = in_RDX;
  bVar2 = std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::empty
                    ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)&FB[1].field_0x8);
  if (bVar2) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  else {
    sVar6 = std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::size
                      ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)&FB[1].field_0x8
                      );
    if (sVar6 == 1) {
      ppWVar7 = std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::back
                          ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)
                           &FB[1].field_0x8);
      pWVar1 = *ppWVar7;
      puVar8 = (uint *)ASDCP::FrameBuffer::RoData((FrameBuffer *)fi._M_node);
      ASDCP::FrameBuffer::Size((FrameBuffer *)fi._M_node);
      Kumu::FileWriter::Write((uchar *)this,(uint)pWVar1,puVar8);
    }
    else {
      std::_List_iterator<WavFileElement_*>::_List_iterator(&stack0xffffffffffffffd8);
      p._4_4_ = *(uint *)&FB->field_0x18 >> 3;
      pbVar9 = ASDCP::FrameBuffer::RoData((FrameBuffer *)fi._M_node);
      end_p = pbVar9;
      uVar4 = ASDCP::FrameBuffer::Size((FrameBuffer *)fi._M_node);
      local_40 = pbVar9 + uVar4;
      while (end_p < local_40) {
        local_48 = (_List_node_base *)
                   std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::begin
                             ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)
                              &FB[1].field_0x8);
        iStack_28 = (iterator)local_48;
        while( true ) {
          iStack_50 = std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::end
                                ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)
                                 &FB[1].field_0x8);
          bVar2 = std::operator!=(&stack0xffffffffffffffd8,&stack0xffffffffffffffb0);
          if (!bVar2) break;
          for (local_54 = 0; local_54 < *(uint *)&FB[1].field_0x20; local_54 = local_54 + 1) {
            ppWVar10 = std::_List_iterator<WavFileElement_*>::operator*(&stack0xffffffffffffffd8);
            WavFileElement::WriteSample(*ppWVar10,end_p,p._4_4_);
            end_p = end_p + p._4_4_;
          }
          local_60 = (_List_node_base *)
                     std::_List_iterator<WavFileElement_*>::operator++(&stack0xffffffffffffffd8,0);
        }
      }
      local_61 = 0;
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
      local_70 = (_List_node_base *)
                 std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::begin
                           ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)
                            &FB[1].field_0x8);
      iStack_28 = (iterator)local_70;
      while( true ) {
        local_78._M_node =
             (_List_node_base *)
             std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::end
                       ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)
                        &FB[1].field_0x8);
        bVar3 = std::operator!=(&stack0xffffffffffffffd8,&local_78);
        bVar2 = false;
        if (bVar3) {
          iVar5 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
          bVar2 = -1 < iVar5;
        }
        if (!bVar2) break;
        std::_List_iterator<WavFileElement_*>::operator*(&stack0xffffffffffffffd8);
        WavFileElement::Flush(&local_e0);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_e0);
        Kumu::Result_t::~Result_t((Result_t *)&local_e0);
        std::_List_iterator<WavFileElement_*>::operator++(&stack0xffffffffffffffd8,0);
      }
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
    WriteFrame(ASDCP::PCM::FrameBuffer& FB)
    {
      if ( m_OutFile.empty() )
	return ASDCP::RESULT_STATE;

      if ( m_OutFile.size() == 1 ) // no de-interleave needed, just write out the frame
	return m_OutFile.back()->Write(FB.RoData(), FB.Size(), 0);
 
      std::list<WavFileElement*>::iterator fi;
      ui32_t sample_size = m_ADesc.QuantizationBits / 8;
      const byte_t* p = FB.RoData();
      const byte_t* end_p = p + FB.Size();

      while ( p < end_p )
	{
	  for ( fi = m_OutFile.begin(); fi != m_OutFile.end(); fi++ )
	    {
	      for ( ui32_t c = 0; c < m_ChannelCount; c++ )
		{
		  (*fi)->WriteSample(p, sample_size);
		  p += sample_size;
		}
	    }
	}

      ASDCP::Result_t result = ASDCP::RESULT_OK;

      for ( fi = m_OutFile.begin(); fi != m_OutFile.end() && ASDCP_SUCCESS(result); fi++ )
	result = (*fi)->Flush();

      return result;
    }